

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LDSketch.cpp
# Opt level: O0

longlong LDSketch_low_estimate(LDSketch_t *sk,uchar *key)

{
  uint uVar1;
  longlong lVar2;
  long in_RDI;
  int index;
  int k;
  int i;
  longlong ret;
  uchar *in_stack_00000038;
  LDSketch_t *in_stack_00000040;
  dyn_tbl_t *local_38;
  int iVar3;
  dyn_tbl_t *dyn_tbl;
  
  iVar3 = 0;
  dyn_tbl = (dyn_tbl_t *)0x0;
  while( true ) {
    if (*(int *)(in_RDI + 8) <= iVar3) break;
    uVar1 = LDSketch_find(in_stack_00000040,in_stack_00000038,sk._4_4_,(int)sk,key._4_4_);
    local_38 = dyn_tbl;
    lVar2 = dyn_tbl_low_estimate(dyn_tbl,(uchar *)CONCAT44(iVar3,uVar1));
    if ((long)dyn_tbl <= lVar2) {
      local_38 = (dyn_tbl_t *)dyn_tbl_low_estimate(local_38,(uchar *)CONCAT44(iVar3,uVar1));
    }
    iVar3 = iVar3 + 1;
    dyn_tbl = local_38;
  }
  return (longlong)dyn_tbl;
}

Assistant:

long long LDSketch_low_estimate(LDSketch_t* sk, unsigned char* key) {
	long long ret = 0;
	for (int i = 0; i < sk->h; ++i) {
		int k = LDSketch_find(sk, key, 0, sk->lgn - 1, i);
		int index = i * sk->w + k;
		ret = MAX(ret, dyn_tbl_low_estimate(sk->tbl[index], key));
	}
	return ret;
}